

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SequenceD.cpp
# Opt level: O0

ostream * operator<<(ostream *os,SequenceD<64> *t_seq)

{
  string local_38;
  SequenceD<64> *local_18;
  SequenceD<64> *t_seq_local;
  ostream *os_local;
  
  local_18 = t_seq;
  t_seq_local = (SequenceD<64> *)os;
  SequenceD<64>::as_char_string_abi_cxx11_(&local_38,t_seq);
  std::operator<<(os,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return (ostream *)t_seq_local;
}

Assistant:

std::ostream &operator<<(std::ostream &os, SequenceD<64> &t_seq) {
    os << t_seq.as_char_string();
    return os;
}